

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyInt32Int64(void)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  int32_t ret;
  TestCase<int,_long,_0> test;
  TestVector<int,_long,_0> tests;
  long in_stack_ffffffffffffff28;
  allocator *in_stack_ffffffffffffff30;
  TestVector<int,_long,_0> *in_stack_ffffffffffffff40;
  byte local_a8;
  allocator local_99;
  string local_98 [36];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_74;
  byte local_6d;
  allocator<char> local_59;
  string local_58 [7];
  undefined1 in_stack_ffffffffffffffaf;
  long in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  int local_30 [4];
  byte local_20;
  TestVector<int,_long,_0> local_18;
  
  TestVector<int,_long,_0>::TestVector(&local_18);
  TestVector<int,_long,_0>::GetNext(in_stack_ffffffffffffff40);
  while( true ) {
    bVar1 = TestVector<int,_long,_0>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeMultiply<int,long>
                      ((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff28,
                       (int *)0x1af8cd);
    if (bVar1 != (bool)(local_20 & 1)) {
      in_stack_ffffffffffffff40 = (TestVector<int,_long,_0> *)&local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"Error in case int_int64: ",(allocator *)in_stack_ffffffffffffff40);
      err_msg<int,long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    local_6d = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_74,local_30);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if ((local_6d & 1) != (local_20 & 1)) {
      in_stack_ffffffffffffff30 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Error in case int_int64 throw: ",in_stack_ffffffffffffff30);
      err_msg<int,long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    TestVector<int,_long,_0>::GetNext(in_stack_ffffffffffffff40);
    local_20 = local_a8;
  }
  return;
}

Assistant:

void MultVerifyInt32Int64()
{
	TestVector< std::int32_t, std::int64_t, OpType::Mult > tests;
	TestCase<std::int32_t, std::int64_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int32_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case int_int64: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int32_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case int_int64 throw: ", test.x, test.y, test.fExpected );
		}

		test = tests.GetNext();
	}
}